

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall
llvm::Triple::getEnvironmentVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  EnvironmentType Kind;
  unsigned_long *puVar1;
  char *pcVar2;
  bool local_101;
  undefined1 local_d0 [8];
  StringRef EnvironmentTypeName;
  StringRef EnvironmentName;
  uint *Micro_local;
  uint *Minor_local;
  uint *Major_local;
  Triple *this_local;
  unsigned_long local_78 [2];
  char *local_68;
  size_t *local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  size_t local_30;
  int local_24;
  unsigned_long local_20;
  char *local_18;
  undefined1 *local_10;
  
  EnvironmentName.Length = (size_t)Micro;
  join_0x00000010_0x00000000_ = getEnvironmentName(this);
  Kind = getEnvironment(this);
  _local_d0 = getEnvironmentTypeName(Kind);
  local_101 = false;
  if (EnvironmentTypeName.Data <= EnvironmentName.Data) {
    local_30 = EnvironmentTypeName.Length;
    local_38 = (char *)local_d0;
    local_40 = EnvironmentTypeName.Data;
    if (EnvironmentTypeName.Data == (char *)0x0) {
      local_24 = 0;
    }
    else {
      local_24 = memcmp((void *)EnvironmentTypeName.Length,(void *)local_d0,
                        (size_t)EnvironmentTypeName.Data);
    }
    local_101 = local_24 == 0;
  }
  if (local_101) {
    local_48 = local_d0;
    local_68 = EnvironmentTypeName.Data;
    local_60 = &EnvironmentTypeName.Length;
    local_78[1] = 0xffffffffffffffff;
    puVar1 = std::min<unsigned_long>((unsigned_long *)&local_68,(unsigned_long *)&EnvironmentName);
    local_68 = (char *)*puVar1;
    pcVar2 = local_68 + EnvironmentTypeName.Length;
    local_78[0] = (long)EnvironmentName.Data - (long)local_68;
    puVar1 = std::min<unsigned_long>(local_78 + 1,local_78);
    local_20 = *puVar1;
    local_10 = local_58;
    EnvironmentName.Data = (char *)local_20;
    EnvironmentTypeName.Length = (size_t)pcVar2;
    local_18 = pcVar2;
  }
  parseVersionFromName(stack0xffffffffffffff40,Major,Minor,(uint *)EnvironmentName.Length);
  return;
}

Assistant:

void Triple::getEnvironmentVersion(unsigned &Major, unsigned &Minor,
                                   unsigned &Micro) const {
  StringRef EnvironmentName = getEnvironmentName();
  StringRef EnvironmentTypeName = getEnvironmentTypeName(getEnvironment());
  if (EnvironmentName.startswith(EnvironmentTypeName))
    EnvironmentName = EnvironmentName.substr(EnvironmentTypeName.size());

  parseVersionFromName(EnvironmentName, Major, Minor, Micro);
}